

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::OnPropertyChange(Element *this,PropertyIdSet *changed_properties)

{
  bool bVar1;
  Position PVar2;
  Display DVar3;
  Visibility VVar4;
  uint uVar5;
  PropertyIdSet *other;
  ComputedValues *this_00;
  LengthPercentageAuto LVar6;
  NumberAuto NVar7;
  bool bVar8;
  bool bVar9;
  bool local_a5;
  float local_a4;
  bool local_9e;
  bool local_9d;
  bool local_9c;
  bool local_82;
  Type TStack_7c;
  bool enable_local_stacking_context;
  float new_z_index;
  ZIndex z_index_property;
  bool filter_or_mask_changed;
  bool border_radius_changed;
  bool new_visibility;
  Type local_68;
  Type local_60;
  Type TStack_54;
  bool sized_height;
  Type local_4c;
  Type local_44;
  bool sized_width;
  bool absolutely_positioned;
  ComputedValues *computed;
  PropertyIdSet changed_properties_forcing_layout;
  bool top_right_bottom_left_changed;
  PropertyIdSet *changed_properties_local;
  Element *this_local;
  
  bVar1 = PropertyIdSet::Contains(changed_properties,Top);
  local_82 = true;
  if (!bVar1) {
    bVar1 = PropertyIdSet::Contains(changed_properties,Right);
    local_82 = true;
    if (!bVar1) {
      bVar1 = PropertyIdSet::Contains(changed_properties,Bottom);
      local_82 = true;
      if (!bVar1) {
        local_82 = PropertyIdSet::Contains(changed_properties,Left);
      }
    }
  }
  changed_properties_forcing_layout.defined_ids.super__Base_bitset<2UL>._M_w[1]._7_1_ = local_82;
  uVar5 = (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0x16])();
  if ((uVar5 & 1) == 0) {
    other = StyleSheetSpecification::GetRegisteredPropertiesForcingLayout();
    _computed = (_WordT  [2])PropertyIdSet::operator&(changed_properties,other);
    bVar1 = PropertyIdSet::Empty((PropertyIdSet *)&computed);
    if (bVar1) {
      if ((changed_properties_forcing_layout.defined_ids.super__Base_bitset<2UL>._M_w[1]._7_1_ & 1)
          != 0) {
        this_00 = GetComputedValues(this);
        PVar2 = Style::ComputedValues::position(this_00);
        bVar1 = true;
        if (PVar2 != Absolute) {
          PVar2 = Style::ComputedValues::position(this_00);
          bVar1 = PVar2 == Fixed;
        }
        LVar6 = Style::ComputedValues::width(this_00);
        local_44 = LVar6.type;
        bVar8 = false;
        if (local_44 == Auto) {
          LVar6 = Style::ComputedValues::left(this_00);
          local_4c = LVar6.type;
          bVar8 = false;
          if (local_4c != Auto) {
            LVar6 = Style::ComputedValues::right(this_00);
            TStack_54 = LVar6.type;
            bVar8 = TStack_54 != Auto;
          }
        }
        LVar6 = Style::ComputedValues::height(this_00);
        local_60 = LVar6.type;
        bVar9 = false;
        if (local_60 == Auto) {
          LVar6 = Style::ComputedValues::top(this_00);
          local_68 = LVar6.type;
          bVar9 = false;
          if (local_68 != Auto) {
            LVar6 = Style::ComputedValues::bottom(this_00);
            z_index_property.value._0_1_ = LVar6.type;
            bVar9 = z_index_property.value._0_1_ != Auto;
          }
        }
        if ((bVar1) && ((bVar8 || (bVar9)))) {
          (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0x15])();
        }
      }
    }
    else {
      (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0x15])();
    }
  }
  if ((changed_properties_forcing_layout.defined_ids.super__Base_bitset<2UL>._M_w[1]._7_1_ & 1) != 0
     ) {
    UpdateOffset(this);
    DirtyAbsoluteOffset(this);
  }
  bVar1 = PropertyIdSet::Contains(changed_properties,Visibility);
  if ((bVar1) || (bVar1 = PropertyIdSet::Contains(changed_properties,Display), bVar1)) {
    DVar3 = Style::ComputedValues::display(&this->meta->computed_values);
    local_9c = false;
    if (DVar3 != None) {
      VVar4 = Style::ComputedValues::visibility(&this->meta->computed_values);
      local_9c = VVar4 == Visible;
    }
    if ((bool)(this->visible & 1U) != local_9c) {
      this->visible = local_9c;
      if (this->parent != (Element *)0x0) {
        DirtyStackingContext(this->parent);
      }
      if ((this->visible & 1U) == 0) {
        Blur(this);
      }
    }
  }
  bVar1 = PropertyIdSet::Contains(changed_properties,BorderTopLeftRadius);
  local_9d = true;
  if (!bVar1) {
    bVar1 = PropertyIdSet::Contains(changed_properties,BorderTopRightRadius);
    local_9d = true;
    if (!bVar1) {
      bVar1 = PropertyIdSet::Contains(changed_properties,BorderBottomRightRadius);
      local_9d = true;
      if (!bVar1) {
        local_9d = PropertyIdSet::Contains(changed_properties,BorderBottomLeftRadius);
      }
    }
  }
  bVar1 = PropertyIdSet::Contains(changed_properties,Filter);
  local_9e = true;
  if (!bVar1) {
    bVar1 = PropertyIdSet::Contains(changed_properties,BackdropFilter);
    local_9e = true;
    if (!bVar1) {
      local_9e = PropertyIdSet::Contains(changed_properties,MaskImage);
    }
  }
  bVar1 = PropertyIdSet::Contains(changed_properties,ZIndex);
  if ((bVar1) || (local_9e != false)) {
    NVar7 = Style::ComputedValues::z_index(&this->meta->computed_values);
    TStack_7c = NVar7.type;
    if (TStack_7c == Auto) {
      local_a4 = 0.0;
    }
    else {
      new_z_index = NVar7.value;
      local_a4 = new_z_index;
    }
    local_a5 = true;
    if ((TStack_7c == Auto) && (local_a5 = true, (this->local_stacking_context_forced & 1U) == 0)) {
      bVar1 = Style::ComputedValues::has_filter(&this->meta->computed_values);
      local_a5 = true;
      if (!bVar1) {
        bVar1 = Style::ComputedValues::has_backdrop_filter(&this->meta->computed_values);
        local_a5 = true;
        if (!bVar1) {
          local_a5 = Style::ComputedValues::has_mask_image(&this->meta->computed_values);
        }
      }
    }
    if (((this->z_index != local_a4) || (NAN(this->z_index) || NAN(local_a4))) ||
       ((bool)(this->local_stacking_context & 1U) != local_a5)) {
      this->z_index = local_a4;
      if ((bool)(this->local_stacking_context & 1U) != local_a5) {
        this->local_stacking_context = local_a5;
        ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::clear
                  (&this->stacking_context);
        this->stacking_context_dirty = (bool)(this->local_stacking_context & 1);
      }
      if (this->parent != (Element *)0x0) {
        DirtyStackingContext(this->parent);
      }
    }
  }
  if (((local_9d != false) ||
      (bVar1 = PropertyIdSet::Contains(changed_properties,BackgroundColor), bVar1)) ||
     ((bVar1 = PropertyIdSet::Contains(changed_properties,Opacity), bVar1 ||
      ((bVar1 = PropertyIdSet::Contains(changed_properties,ImageColor), bVar1 ||
       (bVar1 = PropertyIdSet::Contains(changed_properties,BoxShadow), bVar1)))))) {
    ElementBackgroundBorder::DirtyBackground(&this->meta->background_border);
  }
  if ((((((local_9d != false) ||
         (bVar1 = PropertyIdSet::Contains(changed_properties,BorderTopWidth), bVar1)) ||
        (bVar1 = PropertyIdSet::Contains(changed_properties,BorderRightWidth), bVar1)) ||
       ((bVar1 = PropertyIdSet::Contains(changed_properties,BorderBottomWidth), bVar1 ||
        (bVar1 = PropertyIdSet::Contains(changed_properties,BorderLeftWidth), bVar1)))) ||
      (((bVar1 = PropertyIdSet::Contains(changed_properties,BorderTopColor), bVar1 ||
        ((bVar1 = PropertyIdSet::Contains(changed_properties,BorderRightColor), bVar1 ||
         (bVar1 = PropertyIdSet::Contains(changed_properties,BorderBottomColor), bVar1)))) ||
       (bVar1 = PropertyIdSet::Contains(changed_properties,BorderLeftColor), bVar1)))) ||
     (bVar1 = PropertyIdSet::Contains(changed_properties,Opacity), bVar1)) {
    ElementBackgroundBorder::DirtyBorder(&this->meta->background_border);
  }
  if (((local_9d != false) || (local_9e != false)) ||
     (bVar1 = PropertyIdSet::Contains(changed_properties,Decorator), bVar1)) {
    ElementEffects::DirtyEffects(&this->meta->effects);
  }
  if (((local_9d != false) || (bVar1 = PropertyIdSet::Contains(changed_properties,Opacity), bVar1))
     || (bVar1 = PropertyIdSet::Contains(changed_properties,ImageColor), bVar1)) {
    ElementEffects::DirtyEffectsData(&this->meta->effects);
  }
  bVar1 = PropertyIdSet::Contains(changed_properties,Perspective);
  if (((bVar1) || (bVar1 = PropertyIdSet::Contains(changed_properties,PerspectiveOriginX), bVar1))
     || (bVar1 = PropertyIdSet::Contains(changed_properties,PerspectiveOriginY), bVar1)) {
    DirtyTransformState(this,true,false);
  }
  bVar1 = PropertyIdSet::Contains(changed_properties,Transform);
  if ((((bVar1) || (bVar1 = PropertyIdSet::Contains(changed_properties,TransformOriginX), bVar1)) ||
      (bVar1 = PropertyIdSet::Contains(changed_properties,TransformOriginY), bVar1)) ||
     (bVar1 = PropertyIdSet::Contains(changed_properties,TransformOriginZ), bVar1)) {
    DirtyTransformState(this,false,true);
  }
  bVar1 = PropertyIdSet::Contains(changed_properties,Animation);
  if (bVar1) {
    this->field_0x17 = this->field_0x17 & 0xf7 | 8;
  }
  bVar1 = PropertyIdSet::Contains(changed_properties,Transition);
  if (bVar1) {
    this->field_0x17 = this->field_0x17 & 0xef | 0x10;
  }
  return;
}

Assistant:

void Element::OnPropertyChange(const PropertyIdSet& changed_properties)
{
	RMLUI_ZoneScoped;
	const bool top_right_bottom_left_changed = (           //
		changed_properties.Contains(PropertyId::Top) ||    //
		changed_properties.Contains(PropertyId::Right) ||  //
		changed_properties.Contains(PropertyId::Bottom) || //
		changed_properties.Contains(PropertyId::Left)      //
	);

	// See if the document layout needs to be updated.
	if (!IsLayoutDirty())
	{
		// Force a relayout if any of the changed properties require it.
		const PropertyIdSet changed_properties_forcing_layout =
			(changed_properties & StyleSheetSpecification::GetRegisteredPropertiesForcingLayout());

		if (!changed_properties_forcing_layout.Empty())
		{
			DirtyLayout();
		}
		else if (top_right_bottom_left_changed)
		{
			// Normally, the position properties only affect the position of the element and not the layout. Thus, these properties are not registered
			// as affecting layout. However, when absolutely positioned elements with both left & right, or top & bottom are set to definite values,
			// they affect the size of the element and thereby also the layout. This layout-dirtying condition needs to be registered manually.
			using namespace Style;
			const ComputedValues& computed = GetComputedValues();
			const bool absolutely_positioned = (computed.position() == Position::Absolute || computed.position() == Position::Fixed);
			const bool sized_width =
				(computed.width().type == Width::Auto && computed.left().type != Left::Auto && computed.right().type != Right::Auto);
			const bool sized_height =
				(computed.height().type == Height::Auto && computed.top().type != Top::Auto && computed.bottom().type != Bottom::Auto);

			if (absolutely_positioned && (sized_width || sized_height))
				DirtyLayout();
		}
	}

	// Update the position.
	if (top_right_bottom_left_changed)
	{
		UpdateOffset();
		DirtyAbsoluteOffset();
	}

	// Update the visibility.
	if (changed_properties.Contains(PropertyId::Visibility) || changed_properties.Contains(PropertyId::Display))
	{
		bool new_visibility =
			(meta->computed_values.display() != Style::Display::None && meta->computed_values.visibility() == Style::Visibility::Visible);

		if (visible != new_visibility)
		{
			visible = new_visibility;

			if (parent != nullptr)
				parent->DirtyStackingContext();

			if (!visible)
				Blur();
		}
	}

	const bool border_radius_changed = (                                    //
		changed_properties.Contains(PropertyId::BorderTopLeftRadius) ||     //
		changed_properties.Contains(PropertyId::BorderTopRightRadius) ||    //
		changed_properties.Contains(PropertyId::BorderBottomRightRadius) || //
		changed_properties.Contains(PropertyId::BorderBottomLeftRadius)     //
	);
	const bool filter_or_mask_changed = (changed_properties.Contains(PropertyId::Filter) || changed_properties.Contains(PropertyId::BackdropFilter) ||
		changed_properties.Contains(PropertyId::MaskImage));

	// Update the z-index and stacking context.
	if (changed_properties.Contains(PropertyId::ZIndex) || filter_or_mask_changed)
	{
		const Style::ZIndex z_index_property = meta->computed_values.z_index();

		const float new_z_index = (z_index_property.type == Style::ZIndex::Auto ? 0.f : z_index_property.value);
		const bool enable_local_stacking_context = (z_index_property.type != Style::ZIndex::Auto || local_stacking_context_forced ||
			meta->computed_values.has_filter() || meta->computed_values.has_backdrop_filter() || meta->computed_values.has_mask_image());

		if (z_index != new_z_index || local_stacking_context != enable_local_stacking_context)
		{
			z_index = new_z_index;

			if (local_stacking_context != enable_local_stacking_context)
			{
				local_stacking_context = enable_local_stacking_context;

				// If we are no longer acting as a local stacking context, then we clear the list and are all set. Otherwise, we need to rebuild our
				// local stacking context.
				stacking_context.clear();
				stacking_context_dirty = local_stacking_context;
			}

			// When our z-index or local stacking context changes, then we must dirty our parent stacking context so we are re-indexed.
			if (parent)
				parent->DirtyStackingContext();
		}
	}

	// Dirty the background if it's changed.
	if (border_radius_changed ||                                    //
		changed_properties.Contains(PropertyId::BackgroundColor) || //
		changed_properties.Contains(PropertyId::Opacity) ||         //
		changed_properties.Contains(PropertyId::ImageColor) ||      //
		changed_properties.Contains(PropertyId::BoxShadow))         //
	{
		meta->background_border.DirtyBackground();
	}

	// Dirty the border if it's changed.
	if (border_radius_changed ||                                      //
		changed_properties.Contains(PropertyId::BorderTopWidth) ||    //
		changed_properties.Contains(PropertyId::BorderRightWidth) ||  //
		changed_properties.Contains(PropertyId::BorderBottomWidth) || //
		changed_properties.Contains(PropertyId::BorderLeftWidth) ||   //
		changed_properties.Contains(PropertyId::BorderTopColor) ||    //
		changed_properties.Contains(PropertyId::BorderRightColor) ||  //
		changed_properties.Contains(PropertyId::BorderBottomColor) || //
		changed_properties.Contains(PropertyId::BorderLeftColor) ||   //
		changed_properties.Contains(PropertyId::Opacity))
	{
		meta->background_border.DirtyBorder();
	}

	// Dirty the effects if they've changed.
	if (border_radius_changed || filter_or_mask_changed || changed_properties.Contains(PropertyId::Decorator))
	{
		meta->effects.DirtyEffects();
	}

	// Dirty the effects data when their visual looks may have changed.
	if (border_radius_changed ||                            //
		changed_properties.Contains(PropertyId::Opacity) || //
		changed_properties.Contains(PropertyId::ImageColor))
	{
		meta->effects.DirtyEffectsData();
	}

	// Check for `perspective' and `perspective-origin' changes
	if (changed_properties.Contains(PropertyId::Perspective) ||        //
		changed_properties.Contains(PropertyId::PerspectiveOriginX) || //
		changed_properties.Contains(PropertyId::PerspectiveOriginY))
	{
		DirtyTransformState(true, false);
	}

	// Check for `transform' and `transform-origin' changes
	if (changed_properties.Contains(PropertyId::Transform) ||        //
		changed_properties.Contains(PropertyId::TransformOriginX) || //
		changed_properties.Contains(PropertyId::TransformOriginY) || //
		changed_properties.Contains(PropertyId::TransformOriginZ))
	{
		DirtyTransformState(false, true);
	}

	// Check for `animation' changes
	if (changed_properties.Contains(PropertyId::Animation))
	{
		dirty_animation = true;
	}
	// Check for `transition' changes
	if (changed_properties.Contains(PropertyId::Transition))
	{
		dirty_transition = true;
	}
}